

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O3

size_t chacha_final(chacha_state *S,uint8_t *out)

{
  uint8_t *in;
  size_t bytes;
  
  bytes = *(size_t *)(S->opaque + 0x38);
  if (bytes != 0) {
    in = S->opaque + 0x40;
    if (((ulong)out & 7) == 0) {
      chacha_blocks_ref((chacha_state_conflict *)S,in,out,bytes);
    }
    else {
      chacha_blocks_ref((chacha_state_conflict *)S,in,in,bytes);
      memcpy(out,in,*(size_t *)(S->opaque + 0x38));
    }
  }
  S->opaque[0x70] = '\0';
  S->opaque[0x71] = '\0';
  S->opaque[0x72] = '\0';
  S->opaque[0x73] = '\0';
  S->opaque[0x74] = '\0';
  S->opaque[0x75] = '\0';
  S->opaque[0x76] = '\0';
  S->opaque[0x77] = '\0';
  S->opaque[0x78] = '\0';
  S->opaque[0x79] = '\0';
  S->opaque[0x7a] = '\0';
  S->opaque[0x7b] = '\0';
  S->opaque[0x7c] = '\0';
  S->opaque[0x7d] = '\0';
  S->opaque[0x7e] = '\0';
  S->opaque[0x7f] = '\0';
  S->opaque[0x60] = '\0';
  S->opaque[0x61] = '\0';
  S->opaque[0x62] = '\0';
  S->opaque[99] = '\0';
  S->opaque[100] = '\0';
  S->opaque[0x65] = '\0';
  S->opaque[0x66] = '\0';
  S->opaque[0x67] = '\0';
  S->opaque[0x68] = '\0';
  S->opaque[0x69] = '\0';
  S->opaque[0x6a] = '\0';
  S->opaque[0x6b] = '\0';
  S->opaque[0x6c] = '\0';
  S->opaque[0x6d] = '\0';
  S->opaque[0x6e] = '\0';
  S->opaque[0x6f] = '\0';
  S->opaque[0x50] = '\0';
  S->opaque[0x51] = '\0';
  S->opaque[0x52] = '\0';
  S->opaque[0x53] = '\0';
  S->opaque[0x54] = '\0';
  S->opaque[0x55] = '\0';
  S->opaque[0x56] = '\0';
  S->opaque[0x57] = '\0';
  S->opaque[0x58] = '\0';
  S->opaque[0x59] = '\0';
  S->opaque[0x5a] = '\0';
  S->opaque[0x5b] = '\0';
  S->opaque[0x5c] = '\0';
  S->opaque[0x5d] = '\0';
  S->opaque[0x5e] = '\0';
  S->opaque[0x5f] = '\0';
  S->opaque[0x40] = '\0';
  S->opaque[0x41] = '\0';
  S->opaque[0x42] = '\0';
  S->opaque[0x43] = '\0';
  S->opaque[0x44] = '\0';
  S->opaque[0x45] = '\0';
  S->opaque[0x46] = '\0';
  S->opaque[0x47] = '\0';
  S->opaque[0x48] = '\0';
  S->opaque[0x49] = '\0';
  S->opaque[0x4a] = '\0';
  S->opaque[0x4b] = '\0';
  S->opaque[0x4c] = '\0';
  S->opaque[0x4d] = '\0';
  S->opaque[0x4e] = '\0';
  S->opaque[0x4f] = '\0';
  S->opaque[0x30] = '\0';
  S->opaque[0x31] = '\0';
  S->opaque[0x32] = '\0';
  S->opaque[0x33] = '\0';
  S->opaque[0x34] = '\0';
  S->opaque[0x35] = '\0';
  S->opaque[0x36] = '\0';
  S->opaque[0x37] = '\0';
  S->opaque[0x38] = '\0';
  S->opaque[0x39] = '\0';
  S->opaque[0x3a] = '\0';
  S->opaque[0x3b] = '\0';
  S->opaque[0x3c] = '\0';
  S->opaque[0x3d] = '\0';
  S->opaque[0x3e] = '\0';
  S->opaque[0x3f] = '\0';
  S->opaque[0x20] = '\0';
  S->opaque[0x21] = '\0';
  S->opaque[0x22] = '\0';
  S->opaque[0x23] = '\0';
  S->opaque[0x24] = '\0';
  S->opaque[0x25] = '\0';
  S->opaque[0x26] = '\0';
  S->opaque[0x27] = '\0';
  S->opaque[0x28] = '\0';
  S->opaque[0x29] = '\0';
  S->opaque[0x2a] = '\0';
  S->opaque[0x2b] = '\0';
  S->opaque[0x2c] = '\0';
  S->opaque[0x2d] = '\0';
  S->opaque[0x2e] = '\0';
  S->opaque[0x2f] = '\0';
  S->opaque[0x10] = '\0';
  S->opaque[0x11] = '\0';
  S->opaque[0x12] = '\0';
  S->opaque[0x13] = '\0';
  S->opaque[0x14] = '\0';
  S->opaque[0x15] = '\0';
  S->opaque[0x16] = '\0';
  S->opaque[0x17] = '\0';
  S->opaque[0x18] = '\0';
  S->opaque[0x19] = '\0';
  S->opaque[0x1a] = '\0';
  S->opaque[0x1b] = '\0';
  S->opaque[0x1c] = '\0';
  S->opaque[0x1d] = '\0';
  S->opaque[0x1e] = '\0';
  S->opaque[0x1f] = '\0';
  S->opaque[0] = '\0';
  S->opaque[1] = '\0';
  S->opaque[2] = '\0';
  S->opaque[3] = '\0';
  S->opaque[4] = '\0';
  S->opaque[5] = '\0';
  S->opaque[6] = '\0';
  S->opaque[7] = '\0';
  S->opaque[8] = '\0';
  S->opaque[9] = '\0';
  S->opaque[10] = '\0';
  S->opaque[0xb] = '\0';
  S->opaque[0xc] = '\0';
  S->opaque[0xd] = '\0';
  S->opaque[0xe] = '\0';
  S->opaque[0xf] = '\0';
  return 0;
}

Assistant:

size_t
chacha_final(chacha_state *S, uint8_t *out) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    if (state->leftover) {
        if (chacha_is_aligned(out)) {
            chacha_blocks_ref(state, state->buffer, out, state->leftover);
        } else {
            chacha_blocks_ref(state, state->buffer, state->buffer, state->leftover);
            memcpy(out, state->buffer, state->leftover);
        }
    }
    memset(S, 0, sizeof(chacha_state));
    return state->leftover;
}